

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbTest.c
# Opt level: O3

void Gia_ManDualAndN(Gia_Man_t *p,int *pLits,int n,int *LitZ)

{
  int iVar1;
  uint iLit0;
  int iVar2;
  ulong uVar3;
  
  *LitZ = 1;
  if (n < 1) {
    iVar2 = 0;
    iLit0 = 0;
  }
  else {
    uVar3 = 0;
    iVar2 = 0;
    iLit0 = 0;
    do {
      if ((pLits[uVar3 * 2] < 0) || (pLits[uVar3 * 2 + 1] < 0)) goto LAB_003ac7cd;
      iVar1 = Gia_ManHashAnd(p,pLits[uVar3 * 2] ^ 1,pLits[uVar3 * 2 + 1] ^ 1);
      iLit0 = Gia_ManHashOr(p,iLit0,iVar1);
      iVar2 = Gia_ManHashOr(p,iVar2,pLits[uVar3 * 2 + 1]);
      iVar1 = Gia_ManHashAnd(p,*LitZ,pLits[uVar3 * 2]);
      *LitZ = iVar1;
      uVar3 = uVar3 + 1;
    } while ((uint)n != uVar3);
    if ((int)iLit0 < 0) {
LAB_003ac7cd:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
  }
  iVar2 = Gia_ManHashAnd(p,iVar2,iLit0 ^ 1);
  LitZ[1] = iVar2;
  return;
}

Assistant:

void Gia_ManDualAndN( Gia_Man_t * p, int * pLits, int n, int LitZ[2] )
{
    int i, LitZero = 0, LitOne = 0;
    LitZ[0] = 1;
    for ( i = 0; i < n; i++ )
    {
        int Lit = Gia_ManHashAnd( p, Abc_LitNot(pLits[2*i]), Abc_LitNot(pLits[2*i+1]) );
        LitZero = Gia_ManHashOr( p, LitZero, Lit );
        LitOne  = Gia_ManHashOr( p, LitOne,  pLits[2*i+1] );
        LitZ[0] = Gia_ManHashAnd( p, LitZ[0], pLits[2*i] );
    }
    LitZ[1] = Gia_ManHashAnd( p, LitOne, Abc_LitNot(LitZero) );
    
    if ( fForceZero ) LitZ[0]   = Gia_ManHashAnd( p, LitZ[0], Abc_LitNot(LitZ[1]) );
}